

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  Value *this_00;
  char *__end;
  Location __beg;
  ulong uVar1;
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48;
  CommentPlacement local_24;
  Location pCStack_20;
  CommentPlacement placement_local;
  Location end_local;
  Location begin_local;
  Reader *this_local;
  
  local_24 = placement;
  pCStack_20 = end;
  end_local = begin;
  begin_local = (Location)this;
  if ((this->collectComments_ & 1U) == 0) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_reader.cpp"
                  ,400,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  if (placement == commentAfterOnSameLine) {
    if (this->lastValue_ == (Value *)0x0) {
      __assert_fail("lastValue_ != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_reader.cpp"
                    ,0x193,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    this_00 = this->lastValue_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_48,begin,end,&local_49);
    Value::setComment(this_00,&local_48,local_24);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)&this->commentsBefore_,anon_var_dwarf_b6472 + 8);
    }
    __beg = end_local;
    __end = pCStack_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_80,__beg,__end,&local_81);
    std::__cxx11::string::operator+=((string *)&this->commentsBefore_,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return;
}

Assistant:

void 
Reader::addComment( Location begin, 
                    Location end, 
                    CommentPlacement placement )
{
   assert( collectComments_ );
   if ( placement == commentAfterOnSameLine )
   {
      assert( lastValue_ != 0 );
      lastValue_->setComment( std::string( begin, end ), placement );
   }
   else
   {
      if ( !commentsBefore_.empty() )
         commentsBefore_ += "\n";
      commentsBefore_ += std::string( begin, end );
   }
}